

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall
CConnman::SocketHandlerConnected
          (CConnman *this,vector<CNode_*,_std::allocator<CNode_*>_> *nodes,
          EventsPerSock *events_per_sock)

{
  int err;
  pointer ppCVar1;
  CNode *node;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _func_int *p_Var4;
  undefined1 *puVar5;
  bool bVar6;
  uint uVar7;
  const_iterator cVar8;
  int *piVar9;
  Logger *pLVar10;
  byte bVar11;
  undefined1 *puVar12;
  string *__return_storage_ptr__;
  byte bVar13;
  pointer ppCVar14;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  Span<const_unsigned_char> msg_bytes;
  pair<unsigned_long,_bool> pVar15;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock70;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock68;
  
  puVar5 = &stack0xffffffffffffffd0;
  do {
    puVar12 = puVar5;
    *(undefined8 *)(puVar12 + -0x1000) = 0;
    puVar5 = puVar12 + -0x1000;
  } while ((bool *)(puVar12 + -0x1000) != &criticalblock68.super_unique_lock._M_owns);
  *(EventsPerSock **)(puVar12 + -0x1048) = events_per_sock;
  *(CConnman **)(puVar12 + -0x1050) = this;
  *(undefined8 *)(puVar12 + 0xeff8) = *(undefined8 *)(in_FS_OFFSET + 0x28);
  ppCVar14 = (nodes->super__Vector_base<CNode_*,_std::allocator<CNode_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppCVar1 = (nodes->super__Vector_base<CNode_*,_std::allocator<CNode_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  *(pointer *)(puVar12 + -0x1038) = ppCVar1;
  if (ppCVar14 != ppCVar1) {
    *(long *)(puVar12 + -0x1040) = *(long *)(puVar12 + -0x1050) + 0x308;
    do {
      __return_storage_ptr__ = (string *)(puVar12 + -0x1008);
      node = *ppCVar14;
      *(undefined8 *)(puVar12 + -0x1060) = 0x1a45ef;
      bVar6 = CThreadInterrupt::operator_cast_to_bool(*(CThreadInterrupt **)(puVar12 + -0x1040));
      if (bVar6) break;
      *(Mutex **)(puVar12 + -0x1008) = &node->m_sock_mutex;
      puVar12[-0x1000] = 0;
      *(undefined8 *)(puVar12 + -0x1060) = 0x1a4610;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)__return_storage_ptr__);
      peVar2 = (node->m_sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 == (element_type *)0x0) {
LAB_001a479e:
        *(undefined8 *)(puVar12 + -0x1060) = 0x1a47a3;
        std::unique_lock<std::mutex>::~unique_lock
                  ((unique_lock<std::mutex> *)__return_storage_ptr__);
      }
      else {
        *(element_type **)(puVar12 + -0x1028) = peVar2;
        p_Var3 = (node->m_sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar12 + -0x1020) = p_Var3;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
        *(undefined8 *)(puVar12 + -0x1060) = 0x1a4656;
        cVar8 = std::
                _Hashtable<std::shared_ptr<const_Sock>,_std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>,_std::__detail::_Select1st,_Sock::EqualSharedPtrSock,_Sock::HashSharedPtrSock,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(*(_Hashtable<std::shared_ptr<const_Sock>,_std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>,_std::__detail::_Select1st,_Sock::EqualSharedPtrSock,_Sock::HashSharedPtrSock,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         **)(puVar12 + -0x1048),(key_type *)(puVar12 + -0x1028));
        if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar12 + -0x1020) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          *(undefined8 *)(puVar12 + -0x1060) = 0x1a4668;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar12 + -0x1020));
        }
        if (cVar8.
            super__Node_iterator_base<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_true>
            ._M_cur == (__node_type *)0x0) {
          *(undefined8 *)(puVar12 + -0x1060) = 0x1a46f3;
          std::unique_lock<std::mutex>::~unique_lock
                    ((unique_lock<std::mutex> *)__return_storage_ptr__);
          bVar13 = 0;
          bVar11 = 0;
        }
        else {
          bVar11 = *(byte *)((long)cVar8.
                                   super__Node_iterator_base<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_true>
                                   ._M_cur + 0x19);
          bVar13 = (bVar11 & 4) >> 2;
          *(undefined8 *)(puVar12 + -0x1060) = 0x1a4686;
          std::unique_lock<std::mutex>::~unique_lock
                    ((unique_lock<std::mutex> *)__return_storage_ptr__);
          if ((bVar11 & 2) != 0) {
            *(Mutex **)(puVar12 + -0x1008) = &node->cs_vSend;
            puVar12[-0x1000] = 0;
            *(undefined8 *)(puVar12 + -0x1060) = 0x1a46a4;
            std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)__return_storage_ptr__);
            *(undefined8 *)(puVar12 + -0x1060) = 0x1a46b1;
            pVar15 = SocketSendData(*(CConnman **)(puVar12 + -0x1050),node);
            puVar12[-0x1051] = pVar15.second;
            *(undefined8 *)(puVar12 + -0x1060) = 0x1a46c2;
            std::unique_lock<std::mutex>::~unique_lock
                      ((unique_lock<std::mutex> *)(puVar12 + -0x1008));
            if (pVar15.first != 0) {
              *(undefined8 *)(puVar12 + -0x1060) = 0x1a46d4;
              RecordBytesSent(*(CConnman **)(puVar12 + -0x1050),pVar15.first);
              if ((puVar12[-0x1051] & 1) != 0) {
                bVar11 = 0;
              }
            }
          }
        }
        __return_storage_ptr__ = (string *)(puVar12 + -0x1028);
        if (bVar13 != 0 || (bVar11 & 1) != 0) {
          *(Mutex **)(puVar12 + -0x1028) = &node->m_sock_mutex;
          puVar12[-0x1020] = 0;
          *(undefined8 *)(puVar12 + -0x1060) = 0x1a471c;
          std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)__return_storage_ptr__);
          peVar2 = (node->m_sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (peVar2 == (element_type *)0x0) goto LAB_001a479e;
          p_Var4 = peVar2->_vptr_Sock[4];
          *(undefined8 *)(puVar12 + -0x1060) = 0x1a4738;
          uVar7 = (*p_Var4)(peVar2,puVar12 + -0x1008,0x10000,0x40);
          *(undefined8 *)(puVar12 + -0x1060) = 0x1a4743;
          std::unique_lock<std::mutex>::~unique_lock
                    ((unique_lock<std::mutex> *)__return_storage_ptr__);
          if ((int)uVar7 < 1) {
            if (uVar7 == 0) {
              if (((node->fDisconnect)._M_base._M_i & 1U) == 0) {
                *(undefined8 *)(puVar12 + -0x1060) = 0x1a47e0;
                pLVar10 = LogInstance();
                *(undefined8 *)(puVar12 + -0x1060) = 0x1a47f2;
                bVar6 = BCLog::Logger::WillLogCategoryLevel(pLVar10,NET,Debug);
                if (bVar6) {
                  *(NodeId *)(puVar12 + -0x1028) = node->id;
                  *(string **)(puVar12 + -0x1068) = __return_storage_ptr__;
                  *(char **)(puVar12 + -0x1070) = "socket closed for peer=%d\n";
                  *(undefined8 *)(puVar12 + -0x1078) = 1;
                  *(undefined8 *)(puVar12 + -0x1080) = 0x1a483b;
                  logging_function._M_str = "SocketHandlerConnected";
                  logging_function._M_len = 0x16;
                  source_file._M_str =
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                  ;
                  source_file._M_len = 0x57;
                  LogPrintFormatInternal<long>
                            (logging_function,source_file,0x850,NET,*(Level *)(puVar12 + -0x1078),
                             (ConstevalFormatString<1U>)*(char **)(puVar12 + -0x1070),
                             *(long **)(puVar12 + -0x1068));
                }
              }
LAB_001a48f0:
              *(undefined8 *)(puVar12 + -0x1060) = 0x1a48f8;
              CNode::CloseSocketDisconnect(node);
            }
            else {
              *(undefined8 *)(puVar12 + -0x1060) = 0x1a47af;
              piVar9 = __errno_location();
              err = *piVar9;
              if (err < 0x5a) {
                if ((err != 4) && (err != 0xb)) {
LAB_001a4856:
                  if (((node->fDisconnect)._M_base._M_i & 1U) == 0) {
                    *(undefined8 *)(puVar12 + -0x1060) = 0x1a4869;
                    pLVar10 = LogInstance();
                    *(undefined8 *)(puVar12 + -0x1060) = 0x1a487b;
                    bVar6 = BCLog::Logger::WillLogCategoryLevel(pLVar10,NET,Debug);
                    if (bVar6) {
                      *(NodeId *)(puVar12 + -0x1030) = node->id;
                      *(undefined8 *)(puVar12 + -0x1060) = 0x1a4895;
                      NetworkErrorString_abi_cxx11_(__return_storage_ptr__,err);
                      *(string **)(puVar12 + -0x1060) = __return_storage_ptr__;
                      *(undefined1 **)(puVar12 + -0x1068) = puVar12 + -0x1030;
                      *(char **)(puVar12 + -0x1070) = "socket recv error for peer=%d: %s\n";
                      *(undefined8 *)(puVar12 + -0x1078) = 1;
                      *(undefined8 *)(puVar12 + -0x1080) = 0x1a48d0;
                      logging_function_00._M_str = "SocketHandlerConnected";
                      logging_function_00._M_len = 0x16;
                      source_file_00._M_str =
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                      ;
                      source_file_00._M_len = 0x57;
                      LogPrintFormatInternal<long,std::__cxx11::string>
                                (logging_function_00,source_file_00,0x85b,NET,
                                 *(Level *)(puVar12 + -0x1078),
                                 (ConstevalFormatString<2U>)*(char **)(puVar12 + -0x1070),
                                 *(long **)(puVar12 + -0x1068),
                                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   **)(puVar12 + -0x1060));
                      if (*(undefined1 **)(puVar12 + -0x1028) != puVar12 + -0x1018) {
                        *(undefined8 *)(puVar12 + -0x1060) = 0x1a48f0;
                        operator_delete(*(undefined1 **)(puVar12 + -0x1028),
                                        *(long *)(puVar12 + -0x1018) + 1);
                      }
                    }
                  }
                  goto LAB_001a48f0;
                }
              }
              else if ((err != 0x5a) && (err != 0x73)) goto LAB_001a4856;
            }
          }
          else {
            puVar12[-0x1028] = 0;
            *(undefined8 *)(puVar12 + -0x1060) = 0x1a4763;
            msg_bytes.m_size._0_4_ = uVar7 & 0x7fffffff;
            msg_bytes.m_data = puVar12 + -0x1008;
            msg_bytes.m_size._4_4_ = 0;
            bVar6 = CNode::ReceiveMsgBytes(node,msg_bytes,(bool *)__return_storage_ptr__);
            if (!bVar6) {
              *(undefined8 *)(puVar12 + -0x1060) = 0x1a476f;
              CNode::CloseSocketDisconnect(node);
            }
            LOCK();
            *(long *)(*(long *)(puVar12 + -0x1050) + 0x28) =
                 *(long *)(*(long *)(puVar12 + -0x1050) + 0x28) + (ulong)(uVar7 & 0x7fffffff);
            UNLOCK();
            if (puVar12[-0x1028] == '\x01') {
              *(undefined8 *)(puVar12 + -0x1060) = 0x1a478c;
              CNode::MarkReceivedMsgsForProcessing(node);
              *(undefined8 *)(puVar12 + -0x1060) = 0x1a4796;
              WakeMessageHandler(*(CConnman **)(puVar12 + -0x1050));
            }
          }
        }
        *(undefined8 *)(puVar12 + -0x1060) = 0x1a4905;
        bVar6 = InactivityCheck(*(CConnman **)(puVar12 + -0x1050),node);
        if (bVar6) {
          LOCK();
          (node->fDisconnect)._M_base._M_i = true;
          UNLOCK();
        }
      }
      ppCVar14 = ppCVar14 + 1;
    } while (ppCVar14 != *(pointer *)(puVar12 + -0x1038));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(puVar12 + 0xeff8)) {
    *(undefined **)(puVar12 + -0x1060) = &UNK_001a49d7;
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::SocketHandlerConnected(const std::vector<CNode*>& nodes,
                                      const Sock::EventsPerSock& events_per_sock)
{
    AssertLockNotHeld(m_total_bytes_sent_mutex);

    for (CNode* pnode : nodes) {
        if (interruptNet)
            return;

        //
        // Receive
        //
        bool recvSet = false;
        bool sendSet = false;
        bool errorSet = false;
        {
            LOCK(pnode->m_sock_mutex);
            if (!pnode->m_sock) {
                continue;
            }
            const auto it = events_per_sock.find(pnode->m_sock);
            if (it != events_per_sock.end()) {
                recvSet = it->second.occurred & Sock::RECV;
                sendSet = it->second.occurred & Sock::SEND;
                errorSet = it->second.occurred & Sock::ERR;
            }
        }

        if (sendSet) {
            // Send data
            auto [bytes_sent, data_left] = WITH_LOCK(pnode->cs_vSend, return SocketSendData(*pnode));
            if (bytes_sent) {
                RecordBytesSent(bytes_sent);

                // If both receiving and (non-optimistic) sending were possible, we first attempt
                // sending. If that succeeds, but does not fully drain the send queue, do not
                // attempt to receive. This avoids needlessly queueing data if the remote peer
                // is slow at receiving data, by means of TCP flow control. We only do this when
                // sending actually succeeded to make sure progress is always made; otherwise a
                // deadlock would be possible when both sides have data to send, but neither is
                // receiving.
                if (data_left) recvSet = false;
            }
        }

        if (recvSet || errorSet)
        {
            // typical socket buffer is 8K-64K
            uint8_t pchBuf[0x10000];
            int nBytes = 0;
            {
                LOCK(pnode->m_sock_mutex);
                if (!pnode->m_sock) {
                    continue;
                }
                nBytes = pnode->m_sock->Recv(pchBuf, sizeof(pchBuf), MSG_DONTWAIT);
            }
            if (nBytes > 0)
            {
                bool notify = false;
                if (!pnode->ReceiveMsgBytes({pchBuf, (size_t)nBytes}, notify)) {
                    pnode->CloseSocketDisconnect();
                }
                RecordBytesRecv(nBytes);
                if (notify) {
                    pnode->MarkReceivedMsgsForProcessing();
                    WakeMessageHandler();
                }
            }
            else if (nBytes == 0)
            {
                // socket closed gracefully
                if (!pnode->fDisconnect) {
                    LogDebug(BCLog::NET, "socket closed for peer=%d\n", pnode->GetId());
                }
                pnode->CloseSocketDisconnect();
            }
            else if (nBytes < 0)
            {
                // error
                int nErr = WSAGetLastError();
                if (nErr != WSAEWOULDBLOCK && nErr != WSAEMSGSIZE && nErr != WSAEINTR && nErr != WSAEINPROGRESS)
                {
                    if (!pnode->fDisconnect) {
                        LogDebug(BCLog::NET, "socket recv error for peer=%d: %s\n", pnode->GetId(), NetworkErrorString(nErr));
                    }
                    pnode->CloseSocketDisconnect();
                }
            }
        }

        if (InactivityCheck(*pnode)) pnode->fDisconnect = true;
    }
}